

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctf-2-json-val-req.cpp
# Opt level: O0

void __thiscall
yactfr::internal::JsonIntTypeMappingsFlagsValReq<yactfr::internal::JsonSIntValReq>::
JsonIntTypeMappingsFlagsValReq
          (JsonIntTypeMappingsFlagsValReq<yactfr::internal::JsonSIntValReq> *this,char *propName,
          char *objName,bool allowEmpty)

{
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>_>_>
  local_68;
  byte local_21;
  char *pcStack_20;
  bool allowEmpty_local;
  char *objName_local;
  char *propName_local;
  JsonIntTypeMappingsFlagsValReq<yactfr::internal::JsonSIntValReq> *this_local;
  
  local_68._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  local_68._M_h._M_rehash_policy._4_4_ = 0;
  local_68._M_h._M_rehash_policy._M_next_resize = 0;
  local_68._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_h._M_element_count = 0;
  local_68._M_h._M_buckets = (__buckets_ptr)0x0;
  local_68._M_h._M_bucket_count = 0;
  local_68._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_21 = allowEmpty;
  pcStack_20 = objName;
  objName_local = propName;
  propName_local = (char *)this;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>_>_>
  ::unordered_map(&local_68);
  JsonObjValReq::JsonObjValReq(&this->super_JsonObjValReq,&local_68,true);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>_>_>
  ::~unordered_map(&local_68);
  (this->super_JsonObjValReq).super_JsonValReq._vptr_JsonValReq =
       (_func_int **)&PTR__JsonIntTypeMappingsFlagsValReq_007df830;
  JsonIntRangeSetValReqBase<yactfr::internal::JsonSIntValReq>::JsonIntRangeSetValReqBase
            (&this->_rangeSetReq);
  this->_propName = objName_local;
  this->_objName = pcStack_20;
  this->_allowEmpty = (bool)(local_21 & 1);
  return;
}

Assistant:

explicit JsonIntTypeMappingsFlagsValReq(const char * const propName,
                                            const char * const objName,
                                            const bool allowEmpty = true) :
        JsonObjValReq {{}, true},
        _propName {propName},
        _objName {objName},
        _allowEmpty {allowEmpty}
    {
    }